

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O2

void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *vClauses,Msat_Clause_t *pC)

{
  uint uVar1;
  Msat_Clause_t **ppMVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = Msat_ClauseVecReadSize(vClauses);
  ppMVar2 = Msat_ClauseVecReadArray(vClauses);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while( true ) {
    if (ppMVar2[uVar3] == pC) {
      uVar4 = (ulong)(uVar1 - 1);
      if ((int)(uVar1 - 1) < (int)uVar3) {
        uVar4 = uVar3 & 0xffffffff;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        ppMVar2[uVar3] = ppMVar2[uVar3 + 1];
      }
      Msat_ClauseVecPop(vClauses);
      return;
    }
    if (uVar4 == uVar3) break;
    uVar3 = uVar3 + 1;
  }
  __assert_fail("i < nClauses",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                ,0x1c3,"void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *, Msat_Clause_t *)");
}

Assistant:

void Msat_ClauseRemoveWatch( Msat_ClauseVec_t * vClauses, Msat_Clause_t * pC )
{
    Msat_Clause_t ** pClauses;
    int nClauses, i;
    nClauses = Msat_ClauseVecReadSize( vClauses );
    pClauses = Msat_ClauseVecReadArray( vClauses );
    for ( i = 0; pClauses[i] != pC; i++ )
        assert( i < nClauses );
    for (      ; i < nClauses - 1; i++ )
        pClauses[i] = pClauses[i+1];
    Msat_ClauseVecPop( vClauses );
}